

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * __thiscall
kratos::port_dir_to_str_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,PortDirection direction)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  if ((int)this == 1) {
    __s = "output";
    __a = &local_12;
  }
  else if ((int)this == 0) {
    __s = "input";
    __a = &local_13;
  }
  else {
    __s = "inout";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string port_dir_to_str(PortDirection direction) {
    if (direction == PortDirection::In) {
        return "input";
    } else if (direction == PortDirection::Out) {
        return "output";
    } else {
        return "inout";
    }
}